

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSyncTests.cpp
# Opt level: O1

void __thiscall deqp::gles3::Stress::FenceSyncCase::~FenceSyncCase(FenceSyncCase *this)

{
  ~FenceSyncCase(this);
  operator_delete(this,0xd0);
  return;
}

Assistant:

FenceSyncCase::~FenceSyncCase (void)
{
	FenceSyncCase::deinit();
}